

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O3

err_t beltFMTEncr(u16 *dest,u32 mod,u16 *src,size_t count,octet *key,size_t len,octet *iv)

{
  size_t count_00;
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  err_t eVar3;
  
  eVar3 = 0x6d;
  if (((1 < count) && (len < 0x21)) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    count_00 = count * 2;
    bVar1 = memIsValid(src,count_00);
    if (bVar1 != 0) {
      if ((iv != (octet *)0x0) && (bVar1 = memIsValid(iv,0x10), bVar1 == 0)) {
        return 0x6d;
      }
      bVar1 = memIsValid(key,len);
      if ((bVar1 != 0) && (bVar1 = memIsValid(dest,count_00), bVar1 != 0)) {
        if ((iv != (octet *)0x0) && (bVar1 = memIsDisjoint2(dest,count_00,iv,0x10), bVar1 == 0)) {
          return 0x6d;
        }
        eVar3 = 0x77;
        if (count < 0x259) {
          sVar2 = beltFMTCalcB(mod,count + 1 >> 1);
          state = blobCreate(sVar2 * 8 + 0x90);
          if (state == (blob_t)0x0) {
            eVar3 = 0x6e;
          }
          else {
            beltFMTStart(state,mod,count,key,len);
            memMove(dest,src,count_00);
            beltFMTStepE(dest,iv,state);
            blobClose(state);
            eVar3 = 0;
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t beltFMTEncr(u16 dest[], u32 mod, const u16 src[], size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (count < 2 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, 2 * count) ||
		!memIsNullOrValid(iv, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, 2 * count) ||
		iv && !memIsDisjoint2(dest, 2 * count, iv, 16))
		return ERR_BAD_INPUT;
	if (count > 600)
		return ERR_NOT_IMPLEMENTED;
	// создать состояние
	state = blobCreate(beltFMT_keep(mod, count));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// зашифровать
	beltFMTStart(state, mod, count, key, len);
	memMove(dest, src, 2 * count);
	beltFMTStepE(dest, iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}